

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

UBool __thiscall icu_63::Edits::copyErrorTo(Edits *this,UErrorCode *outErrorCode)

{
  if (U_ZERO_ERROR < *outErrorCode) {
    return '\x01';
  }
  if (U_ZERO_ERROR < this->errorCode_) {
    *outErrorCode = this->errorCode_;
    return '\x01';
  }
  return '\0';
}

Assistant:

UBool Edits::copyErrorTo(UErrorCode &outErrorCode) {
    if (U_FAILURE(outErrorCode)) { return TRUE; }
    if (U_SUCCESS(errorCode_)) { return FALSE; }
    outErrorCode = errorCode_;
    return TRUE;
}